

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O2

unique_ptr<Excel::Stream,_std::default_delete<Excel::Stream>_> __thiscall
CompoundFile::File::stream(File *this,Directory *dir)

{
  SecID *in_RDX;
  undefined8 local_18;
  
  std::
  make_unique<CompoundFile::Stream,CompoundFile::Header&,CompoundFile::SAT&,CompoundFile::SAT&,CompoundFile::Directory_const&,CompoundFile::SecID&,std::istream&>
            ((Header *)&stack0xffffffffffffffe8,(SAT *)((long)&dir[9].m_name.field_2 + 8),
             (SAT *)&dir[10].m_name._M_string_length,(Directory *)&dir[10].m_type,in_RDX,
             (basic_istream<char,_std::char_traits<char>_> *)(dir + 0xb));
  *(undefined8 *)this = local_18;
  return (__uniq_ptr_data<Excel::Stream,_std::default_delete<Excel::Stream>,_true,_true>)
         (__uniq_ptr_data<Excel::Stream,_std::default_delete<Excel::Stream>,_true,_true>)this;
}

Assistant:

inline std::unique_ptr< Excel::Stream >
File::stream( const Directory & dir )
{
	return std::make_unique< CompoundFile::Stream > ( m_header,
		m_sat, m_ssat, dir, m_shortStreamFirstSector, m_stream );
}